

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

void __thiscall
TCV::checkIfArrayCalledWithRightDimensions
          (TCV *this,Variable *variable,string *nodeName,ASTNode *node)

{
  bool bVar1;
  ASTNode *pAVar2;
  int *piVar3;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar4;
  size_type sVar5;
  string local_150;
  undefined4 local_12c;
  undefined1 local_128 [8];
  string errorString_1;
  ASTNode **index;
  iterator __end3;
  iterator __begin3;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string errorString;
  int indices;
  undefined1 local_48 [8];
  string lineNumber;
  ASTNode *node_local;
  string *nodeName_local;
  Variable *variable_local;
  TCV *this_local;
  
  lineNumber.field_2._8_8_ = node;
  pAVar2 = AST::ASTNode::getChild(node,0);
  piVar3 = AST::ASTNode::getLineNumber(pAVar2);
  std::__cxx11::to_string((string *)local_48,*piVar3);
  bVar1 = Variable::isArray(variable);
  if (bVar1) {
    pAVar2 = AST::ASTNode::getChild((ASTNode *)lineNumber.field_2._8_8_,1);
    pdVar4 = AST::ASTNode::getChildren(pAVar2);
    sVar5 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::size(pdVar4);
    errorString.field_2._8_4_ = (undefined4)sVar5;
    piVar3 = Variable::getDimensions(variable);
    if (*piVar3 == errorString.field_2._8_4_) {
      pAVar2 = AST::ASTNode::getChild((ASTNode *)lineNumber.field_2._8_8_,1);
      pdVar4 = AST::ASTNode::getChildren(pAVar2);
      std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::begin
                ((iterator *)&__end3._M_node,pdVar4);
      std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::end((iterator *)&index,pdVar4);
      while (bVar1 = std::operator!=((_Self *)&__end3._M_node,(_Self *)&index), bVar1) {
        errorString_1.field_2._8_8_ =
             std::_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**>::operator*
                       ((_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**> *)
                        &__end3._M_node);
        (**(*(ASTNode **)errorString_1.field_2._8_8_)->_vptr_ASTNode)
                  (*(ASTNode **)errorString_1.field_2._8_8_,this);
        bVar1 = std::operator!=(&this->returnType,"intnum");
        if ((bVar1) && (bVar1 = std::operator!=(&this->returnType,"integer"), bVar1)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,"Array dimensions should be of type integer at line ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48);
          Semantic::Detector::addError(this->detector,(string *)local_128);
          local_12c = 1;
          std::__cxx11::string::~string((string *)local_128);
          goto LAB_00166ed7;
        }
        std::_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**>::operator++
                  ((_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**> *)
                   &__end3._M_node);
      }
      Variable::getRawType_abi_cxx11_(&local_150,variable);
      std::__cxx11::string::operator=((string *)&this->returnType,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                     "missing dimensions for variable ",nodeName);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                     " at line ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&__range3);
      Semantic::Detector::addError(this->detector,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  local_12c = 0;
LAB_00166ed7:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void TCV::checkIfArrayCalledWithRightDimensions(const Variable *variable, std::string &nodeName, AST::ASTNode *node) {
    std::string lineNumber = std::to_string(node->getChild(0)->getLineNumber());
    if (variable->isArray()) {
        int indices = node->getChild(1)->getChildren().size();
        if (variable->getDimensions() != indices) {
            std::string errorString = "missing dimensions for variable " + nodeName + " at line " + lineNumber;
            detector->addError(errorString);
        } else {
            for (const auto &index : node->getChild(1)->getChildren()) {
                index->accept(*this);
                if (returnType != "intnum" && returnType != "integer") {
                    std::string errorString = "Array dimensions should be of type integer at line " + lineNumber;
                    detector->addError(errorString);
                    return;
                }
            }
            returnType = variable->getRawType();
        }
    }
}